

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pagerUndoCallback(void *pCtx,Pgno iPg)

{
  int iVar1;
  DbPage *p;
  PgHdr *pPg;
  Pager *pPager;
  int rc;
  Pgno iPg_local;
  void *pCtx_local;
  
  pPager._0_4_ = 0;
  p = sqlite3PagerLookup((Pager *)pCtx,iPg);
  if (p != (DbPage *)0x0) {
    iVar1 = sqlite3PcachePageRefcount(p);
    if (iVar1 == 1) {
      sqlite3PcacheDrop(p);
    }
    else {
      pPager._0_4_ = readDbPage(p);
      if ((int)pPager == 0) {
        (**(code **)((long)pCtx + 0x108))(p);
      }
      sqlite3PagerUnrefNotNull(p);
    }
  }
  sqlite3BackupRestart(*(sqlite3_backup **)((long)pCtx + 0x70));
  return (int)pPager;
}

Assistant:

static int pagerUndoCallback(void *pCtx, Pgno iPg){
  int rc = SQLITE_OK;
  Pager *pPager = (Pager *)pCtx;
  PgHdr *pPg;

  assert( pagerUseWal(pPager) );
  pPg = sqlite3PagerLookup(pPager, iPg);
  if( pPg ){
    if( sqlite3PcachePageRefcount(pPg)==1 ){
      sqlite3PcacheDrop(pPg);
    }else{
      rc = readDbPage(pPg);
      if( rc==SQLITE_OK ){
        pPager->xReiniter(pPg);
      }
      sqlite3PagerUnrefNotNull(pPg);
    }
  }

  /* Normally, if a transaction is rolled back, any backup processes are
  ** updated as data is copied out of the rollback journal and into the
  ** database. This is not generally possible with a WAL database, as
  ** rollback involves simply truncating the log file. Therefore, if one
  ** or more frames have already been written to the log (and therefore
  ** also copied into the backup databases) as part of this transaction,
  ** the backups must be restarted.
  */
  sqlite3BackupRestart(pPager->pBackup);

  return rc;
}